

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMini.c
# Opt level: O3

void Abc_NtkInputMiniAig(Abc_Frame_t *pAbc,void *p)

{
  Abc_Ntk_t *pNtk;
  
  if (pAbc == (Abc_Frame_t *)0x0) {
    puts("ABC framework is not initialized by calling Abc_Start()");
  }
  pNtk = Abc_NtkFromMiniAig((Mini_Aig_t *)p);
  Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
  return;
}

Assistant:

void Abc_NtkInputMiniAig( Abc_Frame_t * pAbc, void * p )
{
    Abc_Ntk_t * pNtk;
    if ( pAbc == NULL )
        printf( "ABC framework is not initialized by calling Abc_Start()\n" );
    pNtk = Abc_NtkFromMiniAig( (Mini_Aig_t *)p );
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
//    Abc_NtkDelete( pNtk );
}